

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

void lws_wsi_mux_dump_children(lws *wsi)

{
  lws *plVar1;
  lws_log_cx_t *cx;
  int iVar2;
  char *pcVar3;
  lws *wsi_00;
  lws **pplVar4;
  char *pcVar5;
  
  if ((wsi->mux).parent_wsi != (lws *)0x0) {
    iVar2 = lwsl_visible(8);
    if (iVar2 != 0) {
      plVar1 = (wsi->mux).parent_wsi;
      wsi_00 = (plVar1->mux).child_list;
      pplVar4 = &(plVar1->mux).child_list;
      while (wsi_00 != (lws *)0x0) {
        pcVar5 = "?";
        if (wsi_00->role_ops != (lws_role_ops *)0x0) {
          pcVar5 = wsi_00->role_ops->name;
        }
        cx = (wsi->lc).log_cx;
        pcVar3 = lws_wsi_tag(wsi_00);
        _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_wsi_mux_dump_children",
                    "   \\---- child %s %s\n",pcVar5,pcVar3);
        plVar1 = *pplVar4;
        pplVar4 = &(plVar1->mux).sibling_list;
        wsi_00 = (plVar1->mux).sibling_list;
        if (plVar1 == wsi_00) {
          __assert_fail("*w != (*w)->mux.sibling_list",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                        ,0x56c,"void lws_wsi_mux_dump_children(struct lws *)");
        }
      }
    }
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_children(struct lws *wsi)
{
#if defined(_DEBUG)
	if (!wsi->mux.parent_wsi || !lwsl_visible(LLL_INFO))
		return;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {
		lwsl_wsi_info(wsi, "   \\---- child %s %s\n",
				   (*w)->role_ops ? (*w)->role_ops->name : "?",
							   lws_wsi_tag(*w));
		assert(*w != (*w)->mux.sibling_list);
	} lws_end_foreach_llp(w, mux.sibling_list);
#endif
}